

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmerge.c
# Opt level: O3

void h2v1_merged_upsample_565D
               (j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION in_row_group_ctr,
               JSAMPARRAY output_buf)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  jpeg_upsampler *pjVar5;
  JSAMPLE *pJVar6;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var7;
  long lVar8;
  _func_void_j_decompress_ptr *p_Var9;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var10;
  ulong uVar11;
  byte *pbVar12;
  ushort *puVar13;
  byte *pbVar14;
  long lVar15;
  uint uVar16;
  byte *pbVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  
  pjVar5 = cinfo->upsample;
  pJVar6 = cinfo->sample_range_limit;
  p_Var7 = pjVar5[1].upsample;
  lVar8 = *(long *)&pjVar5[1].need_context_rows;
  p_Var9 = pjVar5[2].start_pass;
  p_Var10 = pjVar5[2].upsample;
  uVar4 = cinfo->output_width;
  uVar20 = dither_matrix[cinfo->output_scanline & 3];
  pbVar14 = (*input_buf)[in_row_group_ctr];
  pbVar12 = input_buf[1][in_row_group_ctr];
  pbVar17 = input_buf[2][in_row_group_ctr];
  puVar13 = (ushort *)*output_buf;
  if (1 < uVar4) {
    uVar16 = uVar4 >> 1;
    do {
      lVar24 = (long)*(int *)(p_Var7 + (ulong)*pbVar17 * 4);
      lVar15 = (long)*(int *)(lVar8 + (ulong)*pbVar12 * 4);
      uVar21 = (ulong)*pbVar14;
      uVar23 = uVar20 & 0xff;
      lVar22 = (long)(int)((ulong)(*(long *)(p_Var9 + (ulong)*pbVar17 * 8) +
                                  *(long *)(p_Var10 + (ulong)*pbVar12 * 8)) >> 0x10);
      uVar18 = (uint)(uVar20 >> 8);
      uVar11 = (ulong)pbVar14[1];
      uVar19 = uVar20 >> 8 & 0xff;
      bVar1 = pJVar6[lVar22 + uVar11 + (uVar19 >> 1)];
      bVar2 = pJVar6[lVar24 + uVar11 + uVar19];
      bVar3 = pJVar6[lVar15 + uVar11 + uVar19];
      uVar20 = (ulong)((uVar18 & 0xffff00 | (int)uVar20 << 0x18) >> 8 | uVar18 << 0x18);
      *puVar13 = (ushort)(pJVar6[uVar21 + lVar15 + uVar23] >> 3) |
                 (pJVar6[uVar21 + lVar24 + uVar23] & 0xfff8) * 0x100 +
                 (pJVar6[uVar21 + lVar22 + (uVar23 >> 1)] & 0xfc) * 8;
      puVar13[1] = (ushort)(bVar3 >> 3) | (bVar2 & 0xfff8) * 0x100 + (bVar1 & 0xfc) * 8;
      pbVar12 = pbVar12 + 1;
      pbVar17 = pbVar17 + 1;
      pbVar14 = pbVar14 + 2;
      puVar13 = puVar13 + 2;
      uVar16 = uVar16 - 1;
    } while (uVar16 != 0);
  }
  if ((uVar4 & 1) != 0) {
    uVar11 = (ulong)*pbVar14;
    uVar20 = uVar20 & 0xff;
    *puVar13 = (ushort)(pJVar6[(long)*(int *)(lVar8 + (ulong)*pbVar12 * 4) + uVar11 + uVar20] >> 3)
               | (pJVar6[(long)*(int *)(p_Var7 + (ulong)*pbVar17 * 4) + uVar11 + uVar20] & 0xfff8) *
                 0x100 + (pJVar6[(long)(int)((ulong)(*(long *)(p_Var9 + (ulong)*pbVar17 * 8) +
                                                    *(long *)(p_Var10 + (ulong)*pbVar12 * 8)) >>
                                            0x10) + uVar11 + (uVar20 >> 1)] & 0xfc) * 8;
  }
  return;
}

Assistant:

METHODDEF(void)
h2v1_merged_upsample_565D(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
                          JDIMENSION in_row_group_ctr, JSAMPARRAY output_buf)
{
  if (is_big_endian())
    h2v1_merged_upsample_565D_be(cinfo, input_buf, in_row_group_ctr,
                                 output_buf);
  else
    h2v1_merged_upsample_565D_le(cinfo, input_buf, in_row_group_ctr,
                                 output_buf);
}